

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerTruncFloatToInt(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Builder *this_00;
  undefined4 uVar3;
  Expression *pEVar4;
  Const *pCVar5;
  Binary *pBVar6;
  Unary *pUVar7;
  Const *pCVar8;
  Binary *this_01;
  Expression *pEVar9;
  Unary *pUVar10;
  Binary *this_02;
  Unary *this_03;
  If *this_04;
  If *this_05;
  LocalSet *any;
  LocalSet *append;
  Block *pBVar11;
  ulong uVar12;
  UnaryOp UVar13;
  Type ty;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Block *local_1b8;
  Literal local_1b0;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  undefined1 local_120 [8];
  TempVar highBits;
  undefined1 auStack_f8 [8];
  Literal litZero;
  undefined1 auStack_d8 [8];
  Literal litOne;
  undefined1 auStack_b8 [8];
  Literal u32Max;
  BinaryOp local_98;
  UnaryOp local_90;
  UnaryOp local_8c;
  BinaryOp local_88;
  UnaryOp local_84;
  BinaryOp local_80;
  BinaryOp local_6c;
  undefined1 local_60 [8];
  TempVar f;
  
  auStack_f8 = (undefined1  [8])0x0;
  litZero.field_0.i64 = 0;
  litZero.field_0.func.super_IString.str._M_str = (char *)0x0;
  litOne.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  litOne.field_0.i64 = 0;
  u32Max.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  u32Max.field_0.i64 = 0;
  switch(curr->op) {
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt64:
    local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffff00000000);
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_f8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    local_60._0_4_ = 0x3f800000;
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_d8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    local_60._0_4_ = 0x4f800000;
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_b8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    f.ty.id._4_4_ = TruncUFloat32ToInt32;
    local_90 = ConvertUInt32ToFloat32;
    local_84 = AbsFloat32;
    UVar13 = FloorFloat32;
    local_8c = CeilFloat32;
    u32Max.type.id._4_4_ = GeFloat32;
    local_88 = GtFloat32;
    local_98 = MinFloat32;
    local_80 = DivFloat32;
    local_6c = SubFloat32;
    ty.id = 4;
    break;
  default:
    abort();
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt64:
    local_60 = (undefined1  [8])0x0;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_f8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    local_60 = (undefined1  [8])0x3ff0000000000000;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_d8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    local_60 = (undefined1  [8])0x41f0000000000000;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_b8,(Literal *)local_60);
    Literal::~Literal((Literal *)local_60);
    f.ty.id._4_4_ = TruncUFloat64ToInt32;
    local_90 = ConvertUInt32ToFloat64;
    local_84 = AbsFloat64;
    UVar13 = FloorFloat64;
    local_8c = CeilFloat64;
    u32Max.type.id._4_4_ = GeFloat64;
    local_88 = GtFloat64;
    local_98 = MinFloat64;
    local_80 = DivFloat64;
    local_6c = SubFloat64;
    ty.id = 5;
  }
  getTemp((TempVar *)local_60,this,ty);
  getTemp((TempVar *)local_120,this,(Type)0x2);
  highBits.ty.id = (uintptr_t)curr;
  if ((char)f.pass != '\x01') {
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    uVar3 = local_60._0_4_;
    pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = uVar3;
    (pEVar4->type).id = ty.id;
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    Literal::Literal(&local_1b0,(Literal *)auStack_b8);
    pCVar5 = Builder::makeConst(pBVar2,&local_1b0);
    pBVar6 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = local_80;
    pBVar6->left = pEVar4;
    pBVar6->right = (Expression *)pCVar5;
    Binary::finalize(pBVar6);
    pUVar7 = (Unary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x20,8);
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar7->op = UVar13;
    pUVar7->value = (Expression *)pBVar6;
    Unary::finalize(pUVar7);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    Literal::Literal(&local_198,(Literal *)auStack_b8);
    pCVar5 = Builder::makeConst(pBVar2,&local_198);
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    Literal::Literal(&local_180,(Literal *)auStack_d8);
    pCVar8 = Builder::makeConst(this_00,&local_180);
    pBVar6 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = local_6c;
    pBVar6->left = (Expression *)pCVar5;
    pBVar6->right = (Expression *)pCVar8;
    Binary::finalize(pBVar6);
    this_01 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = local_98;
    this_01->left = (Expression *)pUVar7;
    this_01->right = (Expression *)pBVar6;
    Binary::finalize(this_01);
    Literal::~Literal(&local_180);
    Literal::~Literal(&local_198);
    Literal::~Literal(&local_1b0);
    if ((char)f.pass != '\x01') {
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      uVar3 = local_60._0_4_;
      pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
      pEVar4->_id = LocalGetId;
      *(undefined4 *)(pEVar4 + 1) = uVar3;
      (pEVar4->type).id = ty.id;
      if ((char)f.pass != '\x01') {
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        uVar3 = local_60._0_4_;
        pEVar9 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        *(undefined4 *)(pEVar9 + 1) = uVar3;
        (pEVar9->type).id = ty.id;
        pUVar7 = (Unary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x20,8);
        (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
        (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
        pUVar7->op = f.ty.id._4_4_;
        pUVar7->value = pEVar9;
        Unary::finalize(pUVar7);
        pUVar10 = (Unary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x20,8);
        (pUVar10->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId
        ;
        (pUVar10->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
        pUVar10->op = local_90;
        pUVar10->value = (Expression *)pUVar7;
        Unary::finalize(pUVar10);
        pBVar6 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
        (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar6->op = local_6c;
        pBVar6->left = pEVar4;
        pBVar6->right = (Expression *)pUVar10;
        Binary::finalize(pBVar6);
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        Literal::Literal(&local_168,(Literal *)auStack_b8);
        pCVar5 = Builder::makeConst(pBVar2,&local_168);
        this_02 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_02->op = local_80;
        this_02->left = (Expression *)pBVar6;
        this_02->right = (Expression *)pCVar5;
        Binary::finalize(this_02);
        pUVar7 = (Unary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x20,8);
        (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
        (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
        pUVar7->op = local_8c;
        pUVar7->value = (Expression *)this_02;
        Unary::finalize(pUVar7);
        Literal::~Literal(&local_168);
        if ((char)f.pass != '\x01') {
          pBVar1 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          uVar3 = local_60._0_4_;
          pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
          pEVar4->_id = LocalGetId;
          *(undefined4 *)(pEVar4 + 1) = uVar3;
          (pEVar4->type).id = ty.id;
          pBVar2 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          Literal::Literal(&local_150,(Literal *)auStack_f8);
          pCVar5 = Builder::makeConst(pBVar2,&local_150);
          pBVar6 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
          (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
          pBVar6->op = local_88;
          pBVar6->left = pEVar4;
          pBVar6->right = (Expression *)pCVar5;
          Binary::finalize(pBVar6);
          pUVar10 = (Unary *)MixedArena::allocSpace
                                       (&((this->builder)._M_t.
                                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                          .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                         _M_head_impl)->wasm->allocator,0x20,8);
          (pUVar10->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
               UnaryId;
          (pUVar10->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0
          ;
          pUVar10->op = f.ty.id._4_4_;
          pUVar10->value = (Expression *)this_01;
          Unary::finalize(pUVar10);
          this_03 = (Unary *)MixedArena::allocSpace
                                       (&((this->builder)._M_t.
                                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                          .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                         _M_head_impl)->wasm->allocator,0x20,8);
          (this_03->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
               UnaryId;
          (this_03->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0
          ;
          this_03->op = f.ty.id._4_4_;
          this_03->value = (Expression *)pUVar7;
          Unary::finalize(this_03);
          uVar12 = 0x28;
          this_04 = (If *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
          (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
          (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
          this_04->condition = (Expression *)pBVar6;
          this_04->ifTrue = (Expression *)pUVar10;
          this_04->ifFalse = (Expression *)this_03;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
          If::finalize(this_04,type_);
          Literal::~Literal(&local_150);
          if ((char)f.pass != '\x01') {
            pBVar1 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            uVar3 = local_60._0_4_;
            pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
            pEVar4->_id = LocalGetId;
            *(undefined4 *)(pEVar4 + 1) = uVar3;
            (pEVar4->type).id = ty.id;
            pUVar7 = (Unary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x20,8);
            (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
                 UnaryId;
            (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id =
                 0;
            pUVar7->op = local_84;
            pUVar7->value = pEVar4;
            Unary::finalize(pUVar7);
            pBVar2 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            Literal::Literal(&local_138,(Literal *)auStack_d8);
            pCVar5 = Builder::makeConst(pBVar2,&local_138);
            pBVar6 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
            (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                 BinaryId;
            (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
                 0;
            pBVar6->op = u32Max.type.id._4_4_;
            pBVar6->left = (Expression *)pUVar7;
            pBVar6->right = (Expression *)pCVar5;
            Binary::finalize(pBVar6);
            pCVar5 = Builder::makeConst<int>
                               ((this->builder)._M_t.
                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
            uVar12 = 0x28;
            this_05 = (If *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
            (this_05->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId
            ;
            (this_05->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id =
                 0;
            this_05->condition = (Expression *)pBVar6;
            this_05->ifTrue = (Expression *)this_04;
            this_05->ifFalse = (Expression *)pCVar5;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12
            ;
            If::finalize(this_05,type__00);
            Literal::~Literal(&local_138);
            if ((char)f.pass != '\x01') {
              pBVar1 = (this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
              any = Builder::makeLocalSet
                              (pBVar1,local_60._0_4_,*(Expression **)(highBits.ty.id + 0x18));
              if ((char)highBits.pass != '\x01') {
                append = Builder::makeLocalSet
                                   ((this->builder)._M_t.
                                    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                    .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                    local_120._0_4_,(Expression *)this_05);
                if ((char)f.pass != '\x01') {
                  pBVar2 = (this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                  uVar3 = local_60._0_4_;
                  pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
                  pEVar4->_id = LocalGetId;
                  *(undefined4 *)(pEVar4 + 1) = uVar3;
                  (pEVar4->type).id = ty.id;
                  pUVar7 = (Unary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x20,8);
                  (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id
                       = UnaryId;
                  (pUVar7->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type
                  .id = 0;
                  pUVar7->op = f.ty.id._4_4_;
                  pUVar7->value = pEVar4;
                  Unary::finalize(pUVar7);
                  pBVar11 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)append);
                  pBVar11 = Builder::blockify(pBVar1,(Expression *)pBVar11,(Expression *)pUVar7);
                  local_1b8 = pBVar11;
                  std::
                  _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                            ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&this->highBitVars,&local_1b8,local_120);
                  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::
                  replaceCurrent(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                  .
                                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 ,(Expression *)pBVar11);
                  TempVar::~TempVar((TempVar *)local_120);
                  TempVar::~TempVar((TempVar *)local_60);
                  Literal::~Literal((Literal *)auStack_b8);
                  Literal::~Literal((Literal *)auStack_d8);
                  Literal::~Literal((Literal *)auStack_f8);
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerTruncFloatToInt(Unary* curr) {
    // hiBits = if abs(f) >= 1.0 {
    //    if f > 0.0 {
    //        (unsigned) min(
    //          floor(f / (float) U32_MAX),
    //          (float) U32_MAX - 1,
    //        )
    //    } else {
    //        (unsigned) ceil((f - (float) (unsigned) f) / ((float) U32_MAX))
    //    }
    // } else {
    //    0
    // }
    //
    // loBits = (unsigned) f;

    Literal litZero, litOne, u32Max;
    UnaryOp trunc, convert, abs, floor, ceil;
    Type localType;
    BinaryOp ge, gt, min, div, sub;
    switch (curr->op) {
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64: {
        litZero = Literal((float)0);
        litOne = Literal((float)1);
        u32Max = Literal(((float)UINT_MAX) + 1);
        trunc = TruncUFloat32ToInt32;
        convert = ConvertUInt32ToFloat32;
        localType = Type::f32;
        abs = AbsFloat32;
        ge = GeFloat32;
        gt = GtFloat32;
        min = MinFloat32;
        floor = FloorFloat32;
        ceil = CeilFloat32;
        div = DivFloat32;
        sub = SubFloat32;
        break;
      }
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64: {
        litZero = Literal((double)0);
        litOne = Literal((double)1);
        u32Max = Literal(((double)UINT_MAX) + 1);
        trunc = TruncUFloat64ToInt32;
        convert = ConvertUInt32ToFloat64;
        localType = Type::f64;
        abs = AbsFloat64;
        ge = GeFloat64;
        gt = GtFloat64;
        min = MinFloat64;
        floor = FloorFloat64;
        ceil = CeilFloat64;
        div = DivFloat64;
        sub = SubFloat64;
        break;
      }
      default:
        abort();
    }

    TempVar f = getTemp(localType);
    TempVar highBits = getTemp();

    Expression* gtZeroBranch = builder->makeBinary(
      min,
      builder->makeUnary(
        floor,
        builder->makeBinary(div,
                            builder->makeLocalGet(f, localType),
                            builder->makeConst(u32Max))),
      builder->makeBinary(
        sub, builder->makeConst(u32Max), builder->makeConst(litOne)));
    Expression* ltZeroBranch = builder->makeUnary(
      ceil,
      builder->makeBinary(
        div,
        builder->makeBinary(
          sub,
          builder->makeLocalGet(f, localType),
          builder->makeUnary(
            convert,
            builder->makeUnary(trunc, builder->makeLocalGet(f, localType)))),
        builder->makeConst(u32Max)));

    If* highBitsCalc = builder->makeIf(
      builder->makeBinary(
        gt, builder->makeLocalGet(f, localType), builder->makeConst(litZero)),
      builder->makeUnary(trunc, gtZeroBranch),
      builder->makeUnary(trunc, ltZeroBranch));
    If* highBitsVal = builder->makeIf(
      builder->makeBinary(
        ge,
        builder->makeUnary(abs, builder->makeLocalGet(f, localType)),
        builder->makeConst(litOne)),
      highBitsCalc,
      builder->makeConst(int32_t(0)));
    Block* result = builder->blockify(
      builder->makeLocalSet(f, curr->value),
      builder->makeLocalSet(highBits, highBitsVal),
      builder->makeUnary(trunc, builder->makeLocalGet(f, localType)));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }